

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFileStoreTests::TestresetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoException::
RunImpl(TestresetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoException *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_e8 [8];
  resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper fixtureHelper;
  bool ctorOk;
  TestresetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoException *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper::
  resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper
            ((resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper *)
             local_e8,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::
  ExecuteTest<SuiteFileStoreTests::resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper>
            ((resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper *)
             local_e8,&(this->super_Test).m_details);
  resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper::
  ~resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper
            ((resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper *)
             local_e8);
  return;
}

Assistant:

TEST_FIXTURE(resetBeforeAndAfterWithTestFileManager, Reset_DeleteFileStartup_NoException) {
  try {
    object->reset();
  } catch (Exception& e) {
    CHECK(false);
    throw e;
  }
}